

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_BasicGroundCombatSoldier.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::GED_BasicGroundCombatSoldier::operator==
          (GED_BasicGroundCombatSoldier *this,GED_BasicGroundCombatSoldier *Value)

{
  KBOOL KVar1;
  
  if (this->m_ui16EntityID != Value->m_ui16EntityID) {
    return false;
  }
  if ((((((this->m_i16Offsets[0] == Value->m_i16Offsets[0]) &&
         (this->m_i16Offsets[1] == Value->m_i16Offsets[1])) &&
        (this->m_i16Offsets[2] == Value->m_i16Offsets[2])) &&
       ((KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_EA,&Value->m_EA), !KVar1 &&
        (this->m_i8Ori[0] == Value->m_i8Ori[0])))) &&
      ((this->m_i8Ori[1] == Value->m_i8Ori[1] &&
       ((this->m_i8Ori[2] == Value->m_i8Ori[2] && (this->m_i8Spd == Value->m_i8Spd)))))) &&
     ((this->m_i8HdAz == Value->m_i8HdAz &&
      ((this->m_i8HdElv == Value->m_i8HdElv && (this->m_i8HdScanRt == Value->m_i8HdScanRt)))))) {
    return this->m_i8HdElvRt == Value->m_i8HdElvRt;
  }
  return false;
}

Assistant:

KBOOL GED_BasicGroundCombatSoldier::operator == ( const GED_BasicGroundCombatSoldier & Value ) const
{
    if( m_ui16EntityID      != Value.m_ui16EntityID )   return false;
    if( m_i16Offsets[0]     != Value.m_i16Offsets[0] )  return false;
    if( m_i16Offsets[1]     != Value.m_i16Offsets[1] )  return false;
    if( m_i16Offsets[2]     != Value.m_i16Offsets[2] )  return false;
    if( m_EA                != Value.m_EA )             return false;
    if( m_i8Ori[0]          != Value.m_i8Ori[0] )       return false;
    if( m_i8Ori[1]          != Value.m_i8Ori[1] )       return false;
    if( m_i8Ori[2]          != Value.m_i8Ori[2] )       return false;
    if( m_i8Spd             != Value.m_i8Spd )          return false;
    if( m_i8HdAz            != Value.m_i8HdAz )         return false;
    if( m_i8HdElv           != Value.m_i8HdElv  )       return false;
    if( m_i8HdScanRt        != Value.m_i8HdScanRt )     return false;
    if( m_i8HdElvRt         != Value.m_i8HdElvRt )      return false;
    return true;
}